

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O0

void __thiscall rpn::RPNExpression::Evaluate(RPNExpression *this)

{
  bool bVar1;
  reference this_00;
  pointer pIVar2;
  unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> *expr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>,_std::allocator<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_>_>
  *__range2;
  EvaluationContext context;
  RPNExpression *this_local;
  
  context.commandContext.result.field_2._8_8_ = this;
  EvaluationContext::EvaluationContext((EvaluationContext *)&__range2);
  __end2 = std::
           vector<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>,_std::allocator<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_>_>
           ::begin(&this->rpnExprList);
  expr = (unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> *)
         std::
         vector<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>,_std::allocator<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_>_>
         ::end(&this->rpnExprList);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_*,_std::vector<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>,_std::allocator<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_>_>_>
                                *)&expr);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_*,_std::vector<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>,_std::allocator<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_>_>_>
              ::operator*(&__end2);
    pIVar2 = std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>::operator->
                       (this_00);
    (*pIVar2->_vptr_IExpression[2])(pIVar2,&__range2);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_*,_std::vector<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>,_std::allocator<std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>_>_>_>
    ::operator++(&__end2);
  }
  std::operator<<((ostream *)&std::cout,
                  (string *)
                  &context.resultsCount.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  EvaluationContext::~EvaluationContext((EvaluationContext *)&__range2);
  return;
}

Assistant:

void Evaluate() const
    {
        EvaluationContext context;
        for(const auto& expr : rpnExprList)
        {
            expr->Evaluate(context);
        }
        std::cout << context.commandContext.result;
    }